

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_decompress_safe_partial
              (char *src,char *dst,int compressedSize,int targetOutputSize,int dstCapacity)

{
  ushort *puVar1;
  BYTE *pBVar2;
  byte *pbVar3;
  byte bVar4;
  BYTE BVar5;
  ushort uVar6;
  undefined8 uVar7;
  ushort uVar8;
  uint uVar9;
  ushort *puVar10;
  long lVar11;
  ushort *puVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  BYTE *pBVar16;
  int iVar17;
  BYTE *s;
  ushort *puVar18;
  ushort *__src;
  BYTE *pBVar19;
  ushort *puVar20;
  BYTE *d;
  ulong uVar21;
  BYTE *dstEnd;
  int local_60;
  
  if (targetOutputSize < dstCapacity) {
    dstCapacity = targetOutputSize;
  }
  iVar17 = -1;
  if (src != (char *)0x0) {
    if (dstCapacity == 0) {
      iVar17 = 0;
    }
    else if (compressedSize != 0) {
      puVar1 = (ushort *)(src + compressedSize);
      pBVar2 = (BYTE *)(dst + dstCapacity);
      puVar20 = (ushort *)src;
      dstEnd = (BYTE *)dst;
      if (dstCapacity < 0x40) goto LAB_00111137;
LAB_00110f04:
      __src = (ushort *)((long)puVar20 + 1);
      bVar4 = (byte)*puVar20;
      uVar15 = (ulong)(uint)(bVar4 >> 4);
      if (bVar4 >> 4 == 0xf) {
        if ((ushort *)((long)puVar1 - 0xfU) <= __src) goto LAB_00111125;
        puVar12 = puVar20 + 1;
        uVar13 = 0;
        puVar20 = puVar20 + 8;
        do {
          puVar18 = __src;
          puVar10 = puVar20;
          __src = (ushort *)((long)puVar18 + 1);
          uVar13 = uVar13 + *(byte *)((long)puVar10 + -0xf);
          puVar12 = (ushort *)((long)puVar12 + 1);
          puVar20 = (ushort *)((long)puVar10 + 1);
        } while (puVar10 + -7 < (ushort *)((long)puVar1 - 0xfU) &&
                 *(byte *)((long)puVar10 + -0xf) == 0xff);
        uVar15 = (ulong)uVar13 + 0xf;
        pBVar19 = dstEnd + uVar15;
        if ((CARRY8((ulong)dstEnd,uVar15)) || ((ulong)-(long)puVar12 < uVar15)) {
          __src = puVar10 + -7;
          goto LAB_00111125;
        }
        uVar9 = (uint)bVar4;
        if (dst + (long)dstCapacity + -0x20 < pBVar19) goto LAB_00111216;
        puVar20 = (ushort *)((ulong)uVar13 + (long)puVar10 + 1);
        if (puVar1 + -0x10 < puVar20) {
          __src = puVar10 + -7;
          uVar9 = (uint)bVar4;
          goto LAB_00111216;
        }
        lVar11 = 0;
        do {
          uVar7 = *(undefined8 *)((byte *)((long)__src + lVar11) + 8);
          pBVar16 = dstEnd + lVar11;
          *(undefined8 *)pBVar16 = *(undefined8 *)((long)__src + lVar11);
          *(undefined8 *)(pBVar16 + 8) = uVar7;
          pbVar3 = (byte *)((long)puVar18 + lVar11 + 0x11);
          uVar7 = *(undefined8 *)(pbVar3 + 8);
          *(undefined8 *)(pBVar16 + 0x10) = *(undefined8 *)pbVar3;
          *(undefined8 *)(pBVar16 + 0x18) = uVar7;
          lVar11 = lVar11 + 0x20;
        } while (pBVar16 + 0x20 < pBVar19);
      }
      else {
        pBVar19 = dstEnd + uVar15;
        uVar9 = (uint)bVar4;
        if ((ushort *)((long)puVar1 - 0x11U) < __src) goto LAB_00111216;
        uVar7 = *(undefined8 *)((long)puVar20 + 9);
        *(undefined8 *)dstEnd = *(undefined8 *)__src;
        *(undefined8 *)(dstEnd + 8) = uVar7;
        puVar20 = (ushort *)(uVar15 + (long)__src);
      }
      uVar6 = *puVar20;
      uVar15 = (ulong)uVar6;
      __src = puVar20 + 1;
      pBVar16 = pBVar19 + -uVar15;
      uVar21 = (ulong)(bVar4 & 0xf);
      if (uVar21 == 0xf) {
        if (pBVar16 < dst) goto LAB_00111125;
        uVar9 = 0;
        puVar20 = __src;
        do {
          __src = (ushort *)((long)puVar20 + 1);
          if (puVar1 + -2 <= __src) goto LAB_00111125;
          uVar8 = *puVar20;
          uVar9 = uVar9 + (byte)uVar8;
          puVar20 = __src;
        } while ((byte)uVar8 == 0xff);
        uVar14 = (ulong)uVar9;
        if ((BYTE *)(-uVar14 - 0x10) < pBVar19) goto LAB_00111125;
        uVar21 = uVar14 + 0x13;
        if (pBVar2 + -0x40 <= pBVar19 + uVar14 + 0x13) goto LAB_0011131e;
LAB_00111091:
        if (pBVar16 < dst) goto LAB_00111125;
        dstEnd = pBVar19 + uVar21;
        puVar20 = __src;
        if (uVar6 < 0x10) {
          LZ4_memcpy_using_offset(pBVar19,pBVar16,dstEnd,uVar15);
        }
        else {
          do {
            uVar7 = *(undefined8 *)(pBVar19 + -uVar15 + 8);
            *(undefined8 *)pBVar19 = *(undefined8 *)(pBVar19 + -uVar15);
            *(undefined8 *)(pBVar19 + 8) = uVar7;
            uVar7 = *(undefined8 *)(pBVar19 + -uVar15 + 0x10 + 8);
            *(undefined8 *)(pBVar19 + 0x10) = *(undefined8 *)(pBVar19 + -uVar15 + 0x10);
            *(undefined8 *)(pBVar19 + 0x18) = uVar7;
            pBVar19 = pBVar19 + 0x20;
          } while (pBVar19 < dstEnd);
        }
      }
      else {
        dstEnd = pBVar19 + uVar21 + 4;
        uVar21 = uVar21 + 4;
        if (pBVar2 + -0x40 <= dstEnd) goto LAB_0011131e;
        if ((pBVar16 < dst) || (uVar6 < 8)) goto LAB_00111091;
        *(undefined8 *)pBVar19 = *(undefined8 *)pBVar16;
        *(undefined8 *)(pBVar19 + 8) = *(undefined8 *)(pBVar16 + 8);
        *(undefined2 *)(pBVar19 + 0x10) = *(undefined2 *)(pBVar16 + 0x10);
        puVar20 = __src;
      }
      goto LAB_00110f04;
    }
  }
  return iVar17;
LAB_0011131e:
  if (pBVar16 < dst) {
LAB_00111125:
    local_60 = (int)src;
    return ~(uint)__src + local_60;
  }
  dstEnd = pBVar19 + uVar21;
  puVar20 = __src;
  if (pBVar2 + -0xc < dstEnd) {
    uVar15 = (long)pBVar2 - (long)pBVar19;
    if (uVar21 < (ulong)((long)pBVar2 - (long)pBVar19)) {
      uVar15 = uVar21;
    }
    dstEnd = pBVar19 + uVar15;
    if (pBVar19 < pBVar16 + uVar15) {
      for (; pBVar19 < dstEnd; pBVar19 = pBVar19 + 1) {
        BVar5 = *pBVar16;
        pBVar16 = pBVar16 + 1;
        *pBVar19 = BVar5;
      }
    }
    else {
      memcpy(pBVar19,pBVar16,uVar15);
    }
    pBVar16 = pBVar2;
    if (dstEnd == pBVar2) goto LAB_001113d1;
  }
  else {
    if ((uint)uVar15 < 8) {
      pBVar19[0] = '\0';
      pBVar19[1] = '\0';
      pBVar19[2] = '\0';
      pBVar19[3] = '\0';
      *pBVar19 = *pBVar16;
      pBVar19[1] = pBVar16[1];
      pBVar19[2] = pBVar16[2];
      pBVar19[3] = pBVar16[3];
      uVar15 = (ulong)((uint)uVar15 << 2);
      uVar14 = (ulong)*(uint *)((long)inc32table + uVar15);
      *(undefined4 *)(pBVar19 + 4) = *(undefined4 *)(pBVar16 + uVar14);
      pBVar16 = pBVar16 + (uVar14 - (long)*(int *)((long)dec64table + uVar15));
    }
    else {
      *(undefined8 *)pBVar19 = *(undefined8 *)pBVar16;
      pBVar16 = pBVar16 + 8;
    }
    *(undefined8 *)(pBVar19 + 8) = *(undefined8 *)pBVar16;
    if (0x10 < uVar21) {
      pBVar19 = pBVar19 + 0x10;
      do {
        pBVar16 = pBVar16 + 8;
        *(undefined8 *)pBVar19 = *(undefined8 *)pBVar16;
        pBVar19 = pBVar19 + 8;
      } while (pBVar19 < dstEnd);
    }
  }
LAB_00111137:
  while( true ) {
    __src = (ushort *)((long)puVar20 + 1);
    bVar4 = (byte)*puVar20;
    uVar15 = (ulong)(uint)(bVar4 >> 4);
    if (bVar4 >> 4 == 0xf) break;
    if ((src + (long)compressedSize + -0x10 <= __src) || (dst + (long)dstCapacity + -0x20 < dstEnd))
    goto LAB_00111212;
    uVar7 = *(undefined8 *)((long)puVar20 + 9);
    *(undefined8 *)dstEnd = *(undefined8 *)__src;
    *(undefined8 *)(dstEnd + 8) = uVar7;
    pBVar19 = dstEnd + uVar15;
    uVar21 = (ulong)(bVar4 & 0xf);
    puVar20 = (ushort *)((long)__src + uVar15);
    __src = puVar20 + 1;
    uVar6 = *puVar20;
    uVar15 = (ulong)uVar6;
    pBVar16 = pBVar19 + -uVar15;
    if (((uVar21 == 0xf) || (uVar6 < 8)) || (pBVar16 < dst)) goto LAB_001112c2;
    *(undefined8 *)pBVar19 = *(undefined8 *)pBVar16;
    *(undefined8 *)(pBVar19 + 8) = *(undefined8 *)(pBVar16 + 8);
    *(undefined2 *)(pBVar19 + 0x10) = *(undefined2 *)(pBVar16 + 0x10);
    puVar20 = __src;
    dstEnd = pBVar19 + uVar21 + 4;
  }
  if ((ushort *)((long)puVar1 - 0xfU) <= __src) goto LAB_00111125;
  puVar20 = puVar20 + 1;
  uVar9 = 0;
  do {
    uVar6 = *__src;
    __src = (ushort *)((long)__src + 1);
    uVar9 = uVar9 + (byte)uVar6;
    puVar20 = (ushort *)((long)puVar20 + 1);
  } while (__src < (ushort *)((long)puVar1 - 0xfU) && (byte)uVar6 == 0xff);
  uVar15 = (ulong)uVar9 + 0xf;
  if ((CARRY8((ulong)dstEnd,uVar15)) || ((ulong)-(long)puVar20 < uVar15)) goto LAB_00111125;
LAB_00111212:
  pBVar19 = dstEnd + uVar15;
  uVar9 = (uint)bVar4;
LAB_00111216:
  puVar20 = (ushort *)((long)__src + uVar15);
  if ((pBVar2 + -0xc < pBVar19) || (puVar1 + -4 < puVar20)) {
    if (puVar1 + -4 < puVar20 && puVar20 != puVar1) goto LAB_00111125;
    if (pBVar2 < pBVar19) {
      uVar15 = (long)pBVar2 - (long)dstEnd;
    }
    memmove(dstEnd,__src,uVar15);
    pBVar16 = dstEnd + uVar15;
    if ((pBVar2 <= pBVar19) ||
       (puVar20 = (ushort *)((long)__src + uVar15), pBVar19 = pBVar16, puVar20 == puVar1)) {
LAB_001113d1:
      return (int)pBVar16 - (int)dst;
    }
  }
  else {
    do {
      *(undefined8 *)dstEnd = *(undefined8 *)__src;
      dstEnd = dstEnd + 8;
      __src = __src + 4;
    } while (dstEnd < pBVar19);
  }
  uVar15 = (ulong)*puVar20;
  __src = puVar20 + 1;
  pBVar16 = pBVar19 + -uVar15;
  uVar21 = (ulong)(uVar9 & 0xf);
LAB_001112c2:
  if ((int)uVar21 == 0xf) {
    uVar9 = 0;
    do {
      uVar6 = *__src;
      __src = (ushort *)((long)__src + 1);
      uVar9 = uVar9 + (byte)uVar6;
    } while ((byte)uVar6 == 0xff && __src < puVar1 + -2);
    uVar21 = (ulong)uVar9 + 0xf;
    if ((puVar1 + -2 <= __src) || (CARRY8((ulong)pBVar19,uVar21))) goto LAB_00111125;
  }
  uVar21 = uVar21 + 4;
  goto LAB_0011131e;
}

Assistant:

LZ4_FORCE_O2_GCC_PPC64LE
int LZ4_decompress_safe_partial(const char* src, char* dst, int compressedSize, int targetOutputSize, int dstCapacity)
{
    dstCapacity = MIN(targetOutputSize, dstCapacity);
    return LZ4_decompress_generic(src, dst, compressedSize, dstCapacity,
                                  endOnInputSize, partial_decode,
                                  noDict, (BYTE*)dst, NULL, 0);
}